

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void libtorrent::utp_stream::on_read
               (void *self,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  io_context *this;
  type local_68;
  void *local_30;
  utp_stream *s;
  error_code *peStack_20;
  bool shutdown_local;
  error_code *ec_local;
  size_t bytes_transferred_local;
  void *self_local;
  
  this = *(io_context **)((long)self + 0x60);
  local_30 = self;
  s._7_1_ = shutdown;
  peStack_20 = ec;
  ec_local = (error_code *)bytes_transferred;
  bytes_transferred_local = (size_t)self;
  std::
  bind<void,std::function<void(boost::system::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long_const&>
            (&local_68,
             (function<void_(const_boost::system::error_code_&,_unsigned_long)> *)
             ((long)self + 0x20),ec,(unsigned_long *)&ec_local);
  boost::asio::io_context::
  post<std::_Bind_result<void,std::function<void(boost::system::error_code_const&,unsigned_long)>(boost::system::error_code,unsigned_long)>>
            (this,&local_68);
  std::
  _Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
  ::~_Bind_result(&local_68);
  std::function<void_(const_boost::system::error_code_&,_unsigned_long)>::operator=
            ((function<void_(const_boost::system::error_code_&,_unsigned_long)> *)
             ((long)local_30 + 0x20),(nullptr_t)0x0);
  if (((s._7_1_ & 1) != 0) && (*(long *)((long)local_30 + 0x68) != 0)) {
    detach_utp_impl(*(utp_socket_impl **)((long)local_30 + 0x68));
    *(undefined8 *)((long)local_30 + 0x68) = 0;
  }
  return;
}

Assistant:

void utp_stream::on_read(void* self, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	auto* s = static_cast<utp_stream*>(self);

	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->m_null_buffers);
	s->m_io_service.post(std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		detach_utp_impl(s->m_impl);
		s->m_impl = nullptr;
	}
}